

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_create_index.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalCreateIndex *op)

{
  unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true> *this_00;
  SchemaCatalogEntry *this_01;
  CatalogTransaction transaction;
  int iVar1;
  pointer pCVar2;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  PhysicalOperator *pPVar4;
  reference this_02;
  pointer pEVar5;
  BinderException *pBVar6;
  DatabaseInstance *pDVar7;
  IndexTypeSet *this_03;
  IndexType *pIVar8;
  reference this_04;
  type op_00;
  CatalogException *this_05;
  InternalException *this_06;
  idx_t i;
  ulong __n;
  allocator local_c1;
  optional_ptr<duckdb::IndexType,_true> index_type;
  PlanIndexInput input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  CatalogTransaction local_58;
  
  this_01 = (op->table->super_StandardEntry).schema;
  SchemaCatalogEntry::GetCatalogTransaction(&local_58,this_01,this->context);
  this_00 = &op->info;
  pCVar2 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->(this_00);
  transaction.context.ptr = local_58.context.ptr;
  transaction.db.ptr = local_58.db.ptr;
  transaction.transaction.ptr = local_58.transaction.ptr;
  transaction.transaction_id = local_58.transaction_id;
  transaction.start_time = local_58.start_time;
  oVar3 = SchemaCatalogEntry::GetEntry(this_01,transaction,INDEX_ENTRY,&pCVar2->index_name);
  if (oVar3.ptr == (CatalogEntry *)0x0) {
    __n = 0;
    while (__n < (ulong)((long)(op->unbound_expressions).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(op->unbound_expressions).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(&op->unbound_expressions,__n);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_02);
      iVar1 = (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[0xd])(pEVar5);
      __n = __n + 1;
      if ((char)iVar1 == '\0') {
        pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&input,"Index keys cannot contain expressions with side effects.",
                   (allocator *)&index_type);
        BinderException::BinderException(pBVar6,(string *)&input);
        __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pDVar7 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->context->db);
    this_03 = DBConfig::GetIndexTypes(&pDVar7->config);
    pCVar2 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator->(this_00);
    index_type = IndexTypeSet::FindByName(this_03,&pCVar2->index_type);
    if (index_type.ptr == (IndexType *)0x0) {
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      pCVar2 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                       "Unknown index type: ",&pCVar2->index_type);
      BinderException::BinderException(pBVar6,(string *)&input);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pIVar8 = optional_ptr<duckdb::IndexType,_true>::operator->(&index_type);
    if (pIVar8->create_plan == (index_plan_function_t)0x0) {
      this_06 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&input,"Index type \'%s\' is missing a create_plan function",&local_c1);
      pCVar2 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      ::std::__cxx11::string::string((string *)&local_98,(string *)&pCVar2->index_type);
      InternalException::InternalException<std::__cxx11::string>(this_06,(string *)&input,&local_98)
      ;
      __cxa_throw(this_06,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalDependencyList::AddDependency(&this->dependencies,(CatalogEntry *)op->table);
    this_04 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(&(op->super_LogicalOperator).children,0);
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_04);
    input.table_scan = CreatePlan(this,op_00);
    input.context = this->context;
    input.op = op;
    input.planner = this;
    pIVar8 = optional_ptr<duckdb::IndexType,_true>::operator->(&index_type);
    pPVar4 = (*pIVar8->create_plan)(&input);
  }
  else {
    pCVar2 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator->(this_00);
    if ((pCVar2->super_CreateInfo).on_conflict != IGNORE_ON_CONFLICT) {
      this_05 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&input,"Index with name \"%s\" already exists!",(allocator *)&index_type)
      ;
      pCVar2 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      ::std::__cxx11::string::string((string *)&local_78,(string *)&pCVar2->index_name);
      CatalogException::CatalogException<std::__cxx11::string>(this_05,(string *)&input,&local_78);
      __cxa_throw(this_05,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar4 = Make<duckdb::PhysicalDummyScan,duckdb::vector<duckdb::LogicalType,true>&,unsigned_long&>
                       (this,&(op->super_LogicalOperator).types,
                        &(op->super_LogicalOperator).estimated_cardinality);
  }
  return pPVar4;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalCreateIndex &op) {
	// Early-out, if the index already exists.
	auto &schema = op.table.schema;
	auto entry = schema.GetEntry(schema.GetCatalogTransaction(context), CatalogType::INDEX_ENTRY, op.info->index_name);
	if (entry) {
		if (op.info->on_conflict != OnCreateConflict::IGNORE_ON_CONFLICT) {
			throw CatalogException("Index with name \"%s\" already exists!", op.info->index_name);
		}
		return Make<PhysicalDummyScan>(op.types, op.estimated_cardinality);
	}

	// Ensure that all expressions contain valid scalar functions.
	// E.g., get_current_timestamp(), random(), and sequence values cannot be index keys.
	for (idx_t i = 0; i < op.unbound_expressions.size(); i++) {
		auto &expr = op.unbound_expressions[i];
		if (!expr->IsConsistent()) {
			throw BinderException("Index keys cannot contain expressions with side effects.");
		}
	}

	// If we get here and the index type is not valid index type, we throw an exception.
	const auto index_type = context.db->config.GetIndexTypes().FindByName(op.info->index_type);
	if (!index_type) {
		throw BinderException("Unknown index type: " + op.info->index_type);
	}
	if (!index_type->create_plan) {
		throw InternalException("Index type '%s' is missing a create_plan function", op.info->index_type);
	}

	// Add a dependency for the entire table on which we create the index.
	dependencies.AddDependency(op.table);
	D_ASSERT(op.info->scan_types.size() - 1 <= op.info->names.size());
	D_ASSERT(op.info->scan_types.size() - 1 <= op.info->column_ids.size());

	// Generate a physical plan for the parallel index creation.
	// TABLE SCAN - PROJECTION - (optional) NOT NULL FILTER - (optional) ORDER BY - CREATE INDEX
	D_ASSERT(op.children.size() == 1);
	auto &plan = CreatePlan(*op.children[0]);

	PlanIndexInput input(context, op, *this, plan);
	return index_type->create_plan(input);
}